

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O3

void tcg_gen_orc_vec_arm(TCGContext_conflict *tcg_ctx,uint vece,TCGv_vec r,TCGv_vec a,TCGv_vec b)

{
  ushort uVar1;
  TCGv_vec r_00;
  TCGOp *pTVar2;
  TCGv_vec pTVar3;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_2;
  
  pTVar3 = r;
  r_00 = tcg_temp_new_vec_matching_arm(tcg_ctx,r);
  tcg_gen_not_vec_arm(tcg_ctx,(uint)pTVar3,r_00,b);
  uVar1 = *(ushort *)((undefined1 *)((long)&tcg_ctx->pool_cur + 2) + (long)r);
  pTVar2 = tcg_emit_op_arm(tcg_ctx,INDEX_op_or_vec);
  pTVar2->field_0x1 = (byte)((uint)uVar1 * 0x100 + 0xe00 >> 8) & 0xf;
  pTVar2->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
  pTVar2->args[1] = (TCGArg)(a + (long)tcg_ctx);
  pTVar2->args[2] = (TCGArg)(r_00 + (long)tcg_ctx);
  tcg_temp_free_internal_arm(tcg_ctx,(TCGTemp *)(r_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_orc_vec(TCGContext *tcg_ctx, unsigned vece, TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    if (TCG_TARGET_HAS_orc_vec) {
        vec_gen_op3(tcg_ctx, INDEX_op_orc_vec, 0, r, a, b);
    } else {
        TCGv_vec t = tcg_temp_new_vec_matching(tcg_ctx, r);
        tcg_gen_not_vec(tcg_ctx, 0, t, b);
        tcg_gen_or_vec(tcg_ctx, 0, r, a, t);
        tcg_temp_free_vec(tcg_ctx, t);
    }
}